

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

int handle_else(dmr_C *C,stream *stream,token **line,token *token)

{
  token *ptVar1;
  int iVar2;
  
  ptVar1 = stream->top_if;
  if (stream->ifndef == ptVar1) {
    stream->ifndef = (token *)0x0;
    if (stream->dirty == 0) {
      stream->protect = (ident *)0x0;
    }
    else if (stream->protect != (ident *)0x0) {
      stream->dirty = 0;
    }
  }
  if (ptVar1 == (token *)0x0) {
    stream->dirty = 1;
    stream->protect = (ident *)0x0;
    stream->ifndef = (token *)0x0;
    dmrC_sparse_error(C,token->pos,"unmatched #else within stream");
    return 1;
  }
  if (((ulong)ptVar1->pos & 0x3f) == 0x1d) {
    stream->dirty = 1;
    stream->protect = (ident *)0x0;
    stream->ifndef = (token *)0x0;
    dmrC_sparse_error(C,token->pos,"#else after #else");
  }
  if (C->false_nesting == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if (((ulong)ptVar1->pos & 0x3f) != 0x1b) goto LAB_0011f6d1;
  }
  C->false_nesting = iVar2;
LAB_0011f6d1:
  ptVar1->pos = (position)((ulong)ptVar1->pos & 0xffffffffffffffc0 | 0x1d);
  return 1;
}

Assistant:

static int handle_else(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	struct token *top_if = stream->top_if;
        
        (void) line;
	end_group(stream);

	if (!top_if) {
		nesting_error(stream);
		dmrC_sparse_error(C, token->pos, "unmatched #else within stream");
		return 1;
	}

	if (dmrC_token_type(top_if) == TOKEN_ELSE) {
		nesting_error(stream);
		dmrC_sparse_error(C, token->pos, "#else after #else");
	}
	if (C->false_nesting) {
		if (dmrC_token_type(top_if) == TOKEN_IF)
			C->false_nesting = 0;
	} else {
		C->false_nesting = 1;
	}
	dmrC_token_type(top_if) = TOKEN_ELSE;
	return 1;
}